

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O1

jieba_t * jieba_new(char *dict_path,char *hmm_path,char *user_dict,char *idf_path,
                   char *stop_words_path)

{
  Jieba *this;
  allocator local_d5;
  allocator local_d4;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Jieba *)operator_new(0x6d8);
  std::__cxx11::string::string((string *)&local_50,dict_path,&local_d1);
  std::__cxx11::string::string((string *)&local_70,hmm_path,&local_d2);
  std::__cxx11::string::string((string *)&local_90,user_dict,&local_d3);
  std::__cxx11::string::string((string *)&local_b0,idf_path,&local_d4);
  std::__cxx11::string::string((string *)&local_d0,stop_words_path,&local_d5);
  cppjieba::Jieba::Jieba(this,&local_50,&local_70,&local_90,&local_b0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (jieba_t *)this;
}

Assistant:

jieba_t* jieba_new(const char* dict_path, const char* hmm_path, const char* user_dict, const char* idf_path, const char* stop_words_path) {
  jieba_t* handle = (jieba_t*)(new cppjieba::Jieba(dict_path, hmm_path, user_dict, idf_path, stop_words_path));
  return handle;
}